

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O0

string * rcdiscover::(anonymous_namespace)::extract_abi_cxx11_(uint8_t *p,size_t len)

{
  long in_RDX;
  char *in_RSI;
  string *in_RDI;
  ostringstream out;
  ostringstream local_190 [376];
  long local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  for (; *local_10 != '\0' && local_18 != 0; local_10 = local_10 + 1) {
    std::operator<<((ostream *)local_190,*local_10);
    local_18 = local_18 + -1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string extract(const uint8_t *p, size_t len)
{
  std::ostringstream out;

  while (*p != 0 && len > 0)
  {
    out << static_cast<char>(*p);

    p++;
    len--;
  }

  return out.str();
}